

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::
MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_std::map>
::MapPositional(MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_std::map>
                *this,Group *group_,string *name_,string *help_,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *map_,int *defaultValue_,Options options_)

{
  int iVar1;
  
  NamedBase::NamedBase((NamedBase *)this,name_,help_,options_);
  (this->super_PositionalBase).super_NamedBase.field_0x99 = 1;
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__MapPositional_0021d0c8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_Rb_tree(&(this->map)._M_t,&map_->_M_t);
  iVar1 = *defaultValue_;
  this->value = iVar1;
  this->defaultValue = iVar1;
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

MapPositional(Group &group_, const std::string &name_, const std::string &help_, const Map<K, T> &map_, const T &defaultValue_ = T(), Options options_ = {}):
                PositionalBase(name_, help_, options_), map(map_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }